

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O2

int Aig_ObjReverseLevelNew(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iFan;
  int iVar1;
  Aig_Obj_t *pObj_00;
  int iVar2;
  uint uVar3;
  
  if (p->pFanData != (int *)0x0) {
    iFan = -1;
    iVar2 = 0;
    for (uVar3 = 0; uVar3 < *(uint *)&pObj->field_0x18 >> 6; uVar3 = uVar3 + 1) {
      if (uVar3 == 0) {
        iFan = Aig_ObjFanout0Int(p,pObj->Id);
      }
      else {
        iFan = Aig_ObjFanoutNext(p,iFan);
      }
      pObj_00 = Aig_ManObj(p,iFan >> 1);
      iVar1 = Aig_ObjReverseLevel(p,pObj_00);
      if (iVar2 <= iVar1) {
        iVar2 = iVar1;
      }
    }
    return iVar2 + 1;
  }
  __assert_fail("p->pFanData",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                ,0x79,"int Aig_ObjReverseLevelNew(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

int Aig_ObjReverseLevelNew( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1, LevelCur, Level = 0;
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
    {
        LevelCur = Aig_ObjReverseLevel( p, pFanout );
        Level = Abc_MaxInt( Level, LevelCur );
    }
    return Level + 1;
}